

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O2

void __thiscall CheckBox::setChecked(CheckBox *this,bool checked)

{
  Color *color;
  undefined7 in_register_00000031;
  bool bVar1;
  
  bVar1 = (int)CONCAT71(in_register_00000031,checked) == 0;
  if (bVar1) {
    color = sf::Shape::getFillColor(&(this->button).super_Shape);
  }
  else {
    color = &this->checkColor;
  }
  sf::Shape::setFillColor(&(this->check).super_Shape,color);
  this->_checked = !bVar1;
  return;
}

Assistant:

void CheckBox::setChecked(bool checked) {
    if (!checked) {
        check.setFillColor(button.getFillColor());
        _checked = false;
    } else {
        check.setFillColor(checkColor);
        _checked = true;
    }
}